

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config.c
# Opt level: O2

int write_av1config(Av1Config *config,size_t capacity,size_t *bytes_written,uint8_t *buffer)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((((bytes_written != (size_t *)0x0) && (3 < capacity)) && (config != (Av1Config *)0x0)) &&
     (buffer != (uint8_t *)0x0)) {
    *buffer = config->marker << 7 | config->version;
    buffer[1] = config->seq_profile << 5 | config->seq_level_idx_0;
    buffer[2] = config->chroma_subsampling_y << 2 | config->chroma_subsampling_x << 3 |
                config->monochrome << 4 | config->twelve_bit << 5 |
                config->high_bitdepth << 6 | config->seq_tier_0 << 7 |
                config->chroma_sample_position;
    bVar1 = config->initial_presentation_delay_present << 4;
    buffer[3] = bVar1;
    if (config->initial_presentation_delay_present != '\0') {
      buffer[3] = bVar1 | config->initial_presentation_delay_minus_one;
    }
    *bytes_written = 4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int write_av1config(const Av1Config *config, size_t capacity,
                    size_t *bytes_written, uint8_t *buffer) {
  if (!config || !buffer || capacity < kAv1cSize || !bytes_written) return -1;

  buffer[0] = (config->marker << 7) | config->version;
  buffer[1] = (config->seq_profile << 5) | config->seq_level_idx_0;
  buffer[2] = (config->seq_tier_0 << 7) | (config->high_bitdepth << 6) |
              (config->twelve_bit << 5) | (config->monochrome << 4) |
              (config->chroma_subsampling_x << 3) |
              (config->chroma_subsampling_y << 2) |
              config->chroma_sample_position;
  buffer[3] = config->initial_presentation_delay_present << 4;
  if (config->initial_presentation_delay_present) {
    buffer[3] |= config->initial_presentation_delay_minus_one;
  }

  *bytes_written = kAv1cSize;
  return 0;
}